

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_fast.c
# Opt level: O3

uint32_t lzma_crc32(uint8_t *buf,size_t size,uint32_t crc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  
  uVar2 = ~crc;
  if (8 < size) {
    if (((ulong)buf & 7) != 0) {
      puVar6 = buf + 1;
      do {
        uVar1 = *(uint *)buf;
        buf = (uint8_t *)((long)buf + 1);
        uVar2 = uVar2 >> 8 ^ lzma_crc32_table[0][uVar2 & 0xff ^ (uint)(byte)uVar1];
        size = size - 1;
        uVar3 = (ulong)puVar6 & 7;
        puVar6 = puVar6 + 1;
      } while (uVar3 != 0);
    }
    uVar3 = size & 0xfffffffffffffff8;
    size = (size_t)((uint)size & 7);
    if (0 < (long)uVar3) {
      puVar4 = (uint *)(uVar3 + (long)buf);
      do {
        uVar2 = uVar2 ^ *(uint *)buf;
        uVar1 = *(uint *)((long)buf + 4);
        buf = (uint8_t *)((long)buf + 8);
        uVar2 = lzma_crc32_table[6][uVar2 >> 8 & 0xff] ^ lzma_crc32_table[7][uVar2 & 0xff] ^
                *(uint *)((long)lzma_crc32_table[5] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
                lzma_crc32_table[4][uVar2 >> 0x18] ^ lzma_crc32_table[3][uVar1 & 0xff] ^
                lzma_crc32_table[2][uVar1 >> 8 & 0xff] ^
                *(uint *)((long)lzma_crc32_table[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
                lzma_crc32_table[0][uVar1 >> 0x18];
      } while (buf < puVar4);
    }
  }
  if (size != 0) {
    sVar5 = 0;
    do {
      uVar2 = uVar2 >> 8 ^ lzma_crc32_table[0][uVar2 & 0xff ^ (uint)*(byte *)((long)buf + sVar5)];
      sVar5 = sVar5 + 1;
    } while (size != sVar5);
  }
  return ~uVar2;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_crc32(const uint8_t *buf, size_t size, uint32_t crc)
{
	crc = ~crc;

#ifdef WORDS_BIGENDIAN
	crc = bswap32(crc);
#endif

	if (size > 8) {
		// Fix the alignment, if needed. The if statement above
		// ensures that this won't read past the end of buf[].
		while ((uintptr_t)(buf) & 7) {
			crc = lzma_crc32_table[0][*buf++ ^ A(crc)] ^ S8(crc);
			--size;
		}

		// Calculate the position where to stop.
		const uint8_t *const limit = buf + (size & ~(size_t)(7));

		// Calculate how many bytes must be calculated separately
		// before returning the result.
		size &= (size_t)(7);

		// Calculate the CRC32 using the slice-by-eight algorithm.
		while (buf < limit) {
			crc ^= *(const uint32_t *)(buf);
			buf += 4;

			crc = lzma_crc32_table[7][A(crc)]
			    ^ lzma_crc32_table[6][B(crc)]
			    ^ lzma_crc32_table[5][C(crc)]
			    ^ lzma_crc32_table[4][D(crc)];

			const uint32_t tmp = *(const uint32_t *)(buf);
			buf += 4;

			// At least with some compilers, it is critical for
			// performance, that the crc variable is XORed
			// between the two table-lookup pairs.
			crc = lzma_crc32_table[3][A(tmp)]
			    ^ lzma_crc32_table[2][B(tmp)]
			    ^ crc
			    ^ lzma_crc32_table[1][C(tmp)]
			    ^ lzma_crc32_table[0][D(tmp)];
		}
	}

	while (size-- != 0)
		crc = lzma_crc32_table[0][*buf++ ^ A(crc)] ^ S8(crc);

#ifdef WORDS_BIGENDIAN
	crc = bswap32(crc);
#endif

	return ~crc;
}